

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseBuilder::align(BaseBuilder *this,AlignMode alignMode,uint32_t alignment)

{
  Error EVar1;
  AlignNode *node;
  
  if ((this->super_BaseEmitter)._code != (CodeHolder *)0x0) {
    EVar1 = newAlignNode(this,&node,alignMode,alignment);
    if (EVar1 == 0) {
      addNode(this,(BaseNode *)node);
      EVar1 = 0;
    }
    return EVar1;
  }
  return 5;
}

Assistant:

Error BaseBuilder::align(AlignMode alignMode, uint32_t alignment) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  AlignNode* node;
  ASMJIT_PROPAGATE(newAlignNode(&node, alignMode, alignment));
  ASMJIT_ASSUME(node != nullptr);

  addNode(node);
  return kErrorOk;
}